

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_decoder_factory.h
# Opt level: O2

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
 __thiscall
draco::CreatePredictionSchemeForDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>
          (draco *this,PredictionSchemeMethod method,int att_id,PointCloudDecoder *decoder)

{
  PredictionSchemeWrapTransformBase<int> local_38;
  
  local_38.clamped_value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.clamped_value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.max_correction_ = 0;
  local_38.min_correction_ = 0;
  local_38.clamped_value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.num_components_ = 0;
  local_38.min_value_ = 0;
  local_38.max_value_ = 0;
  local_38.max_dif_ = 0;
  CreatePredictionSchemeForDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>
            (this,method,att_id,decoder,(PredictionSchemeWrapDecodingTransform<int,_int> *)&local_38
            );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_38.clamped_value_.super__Vector_base<int,_std::allocator<int>_>);
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>
CreatePredictionSchemeForDecoder(PredictionSchemeMethod method, int att_id,
                                 const PointCloudDecoder *decoder) {
  return CreatePredictionSchemeForDecoder<DataTypeT, TransformT>(
      method, att_id, decoder, TransformT());
}